

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

_Bool ssh2_transport_filter_queue(ssh2_transport_state *s)

{
  uint type;
  PktInQueue *pPVar1;
  Ssh *ssh;
  PacketLogSettings *pPVar2;
  _Bool _Var3;
  PktIn *pPVar4;
  char *pcVar5;
  
  while( true ) {
    _Var3 = ssh2_common_filter_queue(&s->ppl);
    if (_Var3) {
      return _Var3;
    }
    pPVar1 = (s->ppl).in_pq;
    pPVar4 = (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,false);
    if (pPVar4 == (PktIn *)0x0) {
      return _Var3;
    }
    type = pPVar4->type;
    if ((int)type < 0x32) {
      return _Var3;
    }
    if (s->higher_layer_ok == false) break;
    pPVar1 = (s->ppl).in_pq;
    (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,true);
    pq_base_push(&(s->pq_in_higher).pqb,&pPVar4->qnode);
  }
  ssh = (s->ppl).ssh;
  pPVar2 = ((s->ppl).bpp)->pls;
  pcVar5 = ssh2_pkt_type(pPVar2->kctx,pPVar2->actx,type);
  ssh_proto_error(ssh,"Received premature higher-layer packet, type %d (%s)",(ulong)type,pcVar5);
  return true;
}

Assistant:

static bool ssh2_transport_filter_queue(struct ssh2_transport_state *s)
{
    PktIn *pktin;

    while (1) {
        if (ssh2_common_filter_queue(&s->ppl))
            return true;
        if ((pktin = pq_peek(s->ppl.in_pq)) == NULL)
            return false;

        /* Pass on packets to the next layer if they're outside
         * the range reserved for the transport protocol. */
        if (pktin->type >= 50) {
            /* ... except that we shouldn't tolerate higher-layer
             * packets coming from the server before we've seen
             * the first NEWKEYS. */
            if (!s->higher_layer_ok) {
                ssh_proto_error(s->ppl.ssh, "Received premature higher-"
                                "layer packet, type %d (%s)", pktin->type,
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type));
                return true;
            }

            pq_pop(s->ppl.in_pq);
            pq_push(&s->pq_in_higher, pktin);
        } else {
            /* Anything else is a transport-layer packet that the main
             * process_queue coroutine should handle. */
            return false;
        }
    }
}